

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_vumeter.c
# Opt level: O0

void * vu_new(t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  t_vu *x_00;
  _glist *p_Var2;
  t_symbol *ptVar3;
  _outlet *p_Var4;
  t_float tVar5;
  int local_134;
  undefined1 local_120 [8];
  t_iemgui_drawfunctions w_1;
  char str [144];
  int fthold;
  int ftbreak;
  int fs;
  int scale;
  int f;
  int ldy;
  int ldx;
  int h;
  int w;
  t_vu *x;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  
  x_00 = (t_vu *)iemgui_new(vu_class);
  p_Var2 = canvas_getcurrent();
  iVar1 = sys_zoomfontheight(p_Var2->gl_font,1,0);
  ldx = iVar1 + 5;
  p_Var2 = canvas_getcurrent();
  iVar1 = sys_zoomfontheight(p_Var2->gl_font,1,0);
  ldy = (int)((double)((iVar1 + 5) * 0xa0) / 15.0);
  f = -1;
  p_Var2 = canvas_getcurrent();
  iVar1 = sys_zoomfontheight(p_Var2->gl_font,1,0);
  scale = (int)((double)((iVar1 + 5) * -8) / 15.0);
  ftbreak = 1;
  fthold = (x_00->x_gui).x_fontsize;
  local_120 = (undefined1  [8])vu_draw_new;
  w_1.draw_new = vu_draw_config;
  w_1.draw_config = vu_draw_io;
  w_1.draw_iolets = vu_draw_update;
  w_1.draw_update = vu_draw_select;
  w_1.draw_select = (t_iemdrawfunptr)0x0;
  w_1.draw_erase = (t_iemdrawfunptr)0x0;
  iemgui_setdrawfunctions((t_iemgui *)x_00,(t_iemgui_drawfunctions *)local_120);
  (x_00->x_gui).x_bcol = 0x404040;
  if (((((((argc < 0xb) || (argv->a_type != A_FLOAT)) || (argv[1].a_type != A_FLOAT)) ||
        ((argv[2].a_type != A_SYMBOL && (argv[2].a_type != A_FLOAT)))) ||
       ((argv[3].a_type != A_SYMBOL && (argv[3].a_type != A_FLOAT)))) ||
      (((argv[4].a_type != A_FLOAT || (argv[5].a_type != A_FLOAT)) || (argv[6].a_type != A_FLOAT))))
     || ((argv[7].a_type != A_FLOAT || (argv[10].a_type != A_FLOAT)))) {
    iemgui_new_getnames((t_iemgui *)x_00,1,(t_atom *)0x0);
  }
  else {
    tVar5 = atom_getfloatarg(0,argc,argv);
    ldx = (int)tVar5;
    tVar5 = atom_getfloatarg(1,argc,argv);
    ldy = (int)tVar5;
    iemgui_new_getnames((t_iemgui *)x_00,1,argv);
    ptVar3 = gensym("nosndno");
    (x_00->x_gui).x_snd = ptVar3;
    (x_00->x_gui).x_snd_unexpanded = ptVar3;
    tVar5 = atom_getfloatarg(4,argc,argv);
    f = (int)tVar5;
    tVar5 = atom_getfloatarg(5,argc,argv);
    scale = (int)tVar5;
    tVar5 = atom_getfloatarg(6,argc,argv);
    iem_inttofstyle(&(x_00->x_gui).x_fsf,(int)tVar5);
    tVar5 = atom_getfloatarg(7,argc,argv);
    fthold = (int)tVar5;
    iemgui_all_loadcolors((t_iemgui *)x_00,argv + 8,(t_atom *)0x0,argv + 9);
    tVar5 = atom_getfloatarg(10,argc,argv);
    ftbreak = (int)tVar5;
  }
  if ((argc == 0xc) && (argv[0xb].a_type == A_FLOAT)) {
    tVar5 = atom_getfloatarg(0xb,0xc,argv);
    iem_inttosymargs(&(x_00->x_gui).x_isa,(int)tVar5);
  }
  (x_00->x_gui).x_fsf = (t_iem_fstyle_flags)((uint)(x_00->x_gui).x_fsf & 0xffffff7f);
  (x_00->x_gui).x_fsf =
       (t_iem_fstyle_flags)
       ((uint)(x_00->x_gui).x_fsf & 0xffffffbf | (uint)((x_00->x_gui).x_rcv != (t_symbol *)0x0) << 6
       );
  if (((uint)(x_00->x_gui).x_fsf & 0x3f) == 1) {
    strcpy((x_00->x_gui).x_font,"helvetica");
  }
  else if (((uint)(x_00->x_gui).x_fsf & 0x3f) == 2) {
    strcpy((x_00->x_gui).x_font,"times");
  }
  else {
    (x_00->x_gui).x_fsf = (t_iem_fstyle_flags)((uint)(x_00->x_gui).x_fsf & 0xffffffc0);
    strcpy((x_00->x_gui).x_font,sys_font);
  }
  if (((uint)(x_00->x_gui).x_fsf >> 6 & 1) != 0) {
    pd_bind((t_pd *)x_00,(x_00->x_gui).x_rcv);
  }
  (x_00->x_gui).x_ldx = f;
  (x_00->x_gui).x_ldy = scale;
  if (fthold < 4) {
    local_134 = 4;
  }
  else {
    local_134 = fthold;
  }
  (x_00->x_gui).x_fontsize = local_134;
  iVar1 = iemgui_clip_size(ldx);
  (x_00->x_gui).x_w = iVar1;
  vu_check_height(x_00,ldy);
  if (ftbreak != 0) {
    ftbreak = 1;
  }
  x_00->x_scale = ftbreak;
  x_00->x_peak = 0;
  x_00->x_rms = 0;
  x_00->x_fp = -101.0;
  x_00->x_fr = -101.0;
  iemgui_verify_snd_ne_rcv((t_iemgui *)x_00);
  ptVar3 = gensym("ft1");
  inlet_new((t_object *)x_00,(t_pd *)x_00,&s_float,ptVar3);
  p_Var4 = outlet_new((t_object *)x_00,&s_float);
  x_00->x_out_rms = p_Var4;
  p_Var4 = outlet_new((t_object *)x_00,&s_float);
  x_00->x_out_peak = p_Var4;
  (x_00->x_gui).x_h = (x_00->x_gui).x_h / ((x_00->x_gui).x_glist)->gl_zoom;
  iemgui_newzoom((t_iemgui *)x_00);
  return x_00;
}

Assistant:

static void *vu_new(t_symbol *s, int argc, t_atom *argv)
{
    t_vu *x = (t_vu *)iemgui_new(vu_class);
    int w = IEM_GUI_DEFAULTSIZE, h = IEM_VU_STEPS*IEM_VU_DEFAULTSIZE * IEM_GUI_DEFAULTSIZE_SCALE;
    int ldx = -1, ldy = -8 * IEM_GUI_DEFAULTSIZE_SCALE, f = 0, scale = 1;
    int fs = x->x_gui.x_fontsize;
    int ftbreak = IEM_BNG_DEFAULTBREAKFLASHTIME, fthold = IEM_BNG_DEFAULTHOLDFLASHTIME;
    char str[144];

    IEMGUI_SETDRAWFUNCTIONS(x, vu);

    x->x_gui.x_bcol = 0x404040;

    if((argc >= 11)&&IS_A_FLOAT(argv,0)&&IS_A_FLOAT(argv,1)
       &&(IS_A_SYMBOL(argv,2)||IS_A_FLOAT(argv,2))
       &&(IS_A_SYMBOL(argv,3)||IS_A_FLOAT(argv,3))
       &&IS_A_FLOAT(argv,4)&&IS_A_FLOAT(argv,5)
       &&IS_A_FLOAT(argv,6)&&IS_A_FLOAT(argv,7)
       &&IS_A_FLOAT(argv,10))
    {
        w = (int)atom_getfloatarg(0, argc, argv);
        h = (int)atom_getfloatarg(1, argc, argv);
        iemgui_new_getnames(&x->x_gui, 1, argv);
        x->x_gui.x_snd_unexpanded = x->x_gui.x_snd = gensym("nosndno"); /*no send*/
        ldx = (int)atom_getfloatarg(4, argc, argv);
        ldy = (int)atom_getfloatarg(5, argc, argv);
        iem_inttofstyle(&x->x_gui.x_fsf, atom_getfloatarg(6, argc, argv));
        fs = (int)atom_getfloatarg(7, argc, argv);
        iemgui_all_loadcolors(&x->x_gui, argv+8, NULL, argv+9);
        scale = (int)atom_getfloatarg(10, argc, argv);
    }
    else iemgui_new_getnames(&x->x_gui, 1, 0);
    if((argc == 12)&&IS_A_FLOAT(argv,11))
        iem_inttosymargs(&x->x_gui.x_isa, atom_getfloatarg(11, argc, argv));

    x->x_gui.x_fsf.x_snd_able = 0;
    x->x_gui.x_fsf.x_rcv_able = (0 != x->x_gui.x_rcv);
    if (x->x_gui.x_fsf.x_font_style == 1)
        strcpy(x->x_gui.x_font, "helvetica");
    else if(x->x_gui.x_fsf.x_font_style == 2)
        strcpy(x->x_gui.x_font, "times");
    else { x->x_gui.x_fsf.x_font_style = 0;
        strcpy(x->x_gui.x_font, sys_font); }
    if(x->x_gui.x_fsf.x_rcv_able)
        pd_bind(&x->x_gui.x_obj.ob_pd, x->x_gui.x_rcv);
    x->x_gui.x_ldx = ldx;
    x->x_gui.x_ldy = ldy;
    x->x_gui.x_fontsize = (fs < 4)?4:fs;
    x->x_gui.x_w = iemgui_clip_size(w);
    vu_check_height(x, h);
    if(scale != 0)
        scale = 1;
    x->x_scale = scale;
    x->x_peak = 0;
    x->x_rms = 0;
    x->x_fp = -101.0;
    x->x_fr = -101.0;
    iemgui_verify_snd_ne_rcv(&x->x_gui);
    inlet_new(&x->x_gui.x_obj, &x->x_gui.x_obj.ob_pd, &s_float, gensym("ft1"));
    x->x_out_rms = outlet_new(&x->x_gui.x_obj, &s_float);
    x->x_out_peak = outlet_new(&x->x_gui.x_obj, &s_float);
    x->x_gui.x_h /= IEMGUI_ZOOM(x); /* unzoom, to prevent double-application in iemgui_newzoom */
    iemgui_newzoom(&x->x_gui);
    return (x);
}